

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  u8 uVar2;
  Vdbe *pVVar3;
  WhereLoop *pWVar4;
  Index *pIVar5;
  ExprList *pEVar6;
  WhereLevel *pWVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Expr *p;
  ExprList *pEVar11;
  InLoop *pIVar12;
  ulong uVar13;
  long lVar14;
  int p1;
  uint uVar15;
  long lVar16;
  sqlite3 *db;
  Expr *pEVar17;
  ExprList_item *pEVar18;
  long lVar19;
  uint uVar20;
  ExprList *local_b8;
  int local_ac;
  int *local_a8;
  int iTab;
  long local_90;
  int local_84;
  Expr *local_80;
  ExprList *local_78;
  sqlite3 *local_70;
  ExprList_item *local_68;
  ExprList_item *local_60;
  Vdbe *local_58;
  WhereTerm *local_50;
  WhereLevel *local_48;
  ExprList *local_40;
  ExprList *local_38;
  
  pEVar17 = pTerm->pExpr;
  uVar2 = pEVar17->op;
  if (uVar2 != '5') {
    pVVar3 = pParse->pVdbe;
    if (uVar2 == '2') {
      sqlite3VdbeAddOp2(pVVar3,0x49,0,iTarget);
      goto LAB_0018e368;
    }
    if (uVar2 != '-') {
      pWVar4 = pLevel->pWLoop;
      if ((((pWVar4->wsFlags & 0x400) == 0) &&
          (pIVar5 = (pWVar4->u).btree.pIndex, pIVar5 != (Index *)0x0)) &&
         (pIVar5->aSortOrder[iEq] != '\0')) {
        bRev = (int)(bRev == 0);
      }
      lVar19 = (long)iEq;
      uVar10 = 0;
      uVar13 = 0;
      if (0 < iEq) {
        uVar13 = (ulong)(uint)iEq;
      }
      for (; local_58 = pVVar3, uVar13 != uVar10; uVar10 = uVar10 + 1) {
        if ((pWVar4->aLTerm[uVar10] != (WhereTerm *)0x0) &&
           (pWVar4->aLTerm[uVar10]->pExpr == pEVar17)) goto LAB_0018e368;
      }
      uVar20 = 0;
      for (lVar14 = lVar19; lVar14 < (long)(ulong)pWVar4->nLTerm; lVar14 = lVar14 + 1) {
        uVar20 = uVar20 + (pWVar4->aLTerm[lVar14]->pExpr == pEVar17);
      }
      local_90 = CONCAT44(local_90._4_4_,bRev);
      iTab = 0;
      local_84 = iTarget;
      local_50 = pTerm;
      local_48 = pLevel;
      if (((pEVar17->flags & 0x800) == 0) || (((pEVar17->x).pSelect)->pEList->nExpr == 1)) {
        local_a8 = (int *)0x0;
        local_ac = sqlite3FindInIndex(pParse,pEVar17,4,(int *)0x0,(int *)0x0,&iTab);
        p1 = iTab;
      }
      else {
        db = pParse->db;
        p = sqlite3ExprDup(db,pEVar17,0);
        local_ac = 5;
        local_70 = db;
        if (db->mallocFailed == '\0') {
          local_40 = ((p->x).pSelect)->pEList;
          pEVar6 = (p->pLeft->x).pList;
          pEVar18 = local_40->a;
          pEVar11 = (ExprList *)0x0;
          local_b8 = (ExprList *)0x0;
          local_80 = p;
          local_68 = pEVar18;
          local_38 = pEVar6;
          for (lVar14 = lVar19; db = local_70, lVar14 < (long)(ulong)pWVar4->nLTerm;
              lVar14 = lVar14 + 1) {
            if (pWVar4->aLTerm[lVar14]->pExpr == pEVar17) {
              lVar16 = (long)pWVar4->aLTerm[lVar14]->iField;
              if (pEVar18[lVar16 + -1].pExpr != (Expr *)0x0) {
                local_60 = pEVar18 + lVar16 + -1;
                local_78 = pEVar11;
                local_b8 = sqlite3ExprListAppend(pParse,local_b8,pEVar18[lVar16 + -1].pExpr);
                local_60->pExpr = (Expr *)0x0;
                pEVar11 = sqlite3ExprListAppend(pParse,local_78,pEVar6->a[lVar16 + -1].pExpr);
                pEVar6->a[lVar16 + -1].pExpr = (Expr *)0x0;
                pEVar18 = local_68;
              }
            }
          }
          sqlite3ExprListDelete(local_70,local_40);
          sqlite3ExprListDelete(db,local_38);
          (local_80->pLeft->x).pList = pEVar11;
          ((local_80->x).pSelect)->pEList = local_b8;
          if ((pEVar11 != (ExprList *)0x0) && (pEVar11->nExpr == 1)) {
            pEVar17 = pEVar11->a[0].pExpr;
            pEVar11->a[0].pExpr = (Expr *)0x0;
            sqlite3ExprDelete(db,local_80->pLeft);
            local_80->pLeft = pEVar17;
          }
          pTerm = local_50;
          pEVar6 = ((local_80->x).pSelect)->pOrderBy;
          if (pEVar6 != (ExprList *)0x0) {
            uVar13 = 0;
            uVar10 = (ulong)(uint)pEVar6->nExpr;
            if (pEVar6->nExpr < 1) {
              uVar10 = uVar13;
            }
            for (; uVar10 * 0x20 != uVar13; uVar13 = uVar13 + 0x20) {
              *(undefined2 *)((long)&pEVar6->a[0].u + uVar13) = 0;
            }
          }
          if (db->mallocFailed == '\0') {
            local_a8 = (int *)sqlite3DbMallocZero(pParse->db,(ulong)uVar20 << 2);
            db = local_70;
            p = local_80;
            local_ac = sqlite3FindInIndex(pParse,local_80,4,(int *)0x0,local_a8,&iTab);
            pTerm->pExpr->iTable = iTab;
            p1 = iTab;
          }
          else {
            local_a8 = (int *)0x0;
            p = local_80;
            p1 = 0;
          }
        }
        else {
          local_a8 = (int *)0x0;
          p1 = 0;
        }
        sqlite3ExprDelete(db,p);
        pEVar17 = pTerm->pExpr;
      }
      uVar15 = (uint)((uint)local_90 == 0);
      if (local_ac != 4) {
        uVar15 = (uint)local_90;
      }
      sqlite3VdbeAddOp2(local_58,(uint)(uVar15 == 0) * 4 + 0x20,p1,0);
      pWVar7 = local_48;
      pbVar1 = (byte *)((long)&pWVar4->wsFlags + 1);
      *pbVar1 = *pbVar1 | 8;
      iVar8 = (local_48->u).in.nIn;
      if (iVar8 == 0) {
        iVar8 = pParse->nLabel + -1;
        pParse->nLabel = iVar8;
        local_48->addrNxt = iVar8;
        iVar8 = (local_48->u).in.nIn;
      }
      local_90 = CONCAT44(local_90._4_4_,iVar8);
      (local_48->u).in.nIn = uVar20 + iVar8;
      pIVar12 = (InLoop *)
                sqlite3DbReallocOrFree
                          (pParse->db,(local_48->u).in.aInLoop,(long)(int)(uVar20 + iVar8) * 0x14);
      (pWVar7->u).in.aInLoop = pIVar12;
      if (pIVar12 == (InLoop *)0x0) {
        (pWVar7->u).in.nIn = 0;
      }
      else {
        pIVar12 = pIVar12 + (int)(uint)local_90;
        local_60 = (ExprList_item *)(CONCAT71(local_60._1_7_,uVar15 == 0) | 4);
        local_68 = (ExprList_item *)CONCAT44(local_68._4_4_,local_84 - iEq);
        lVar14 = 0;
        local_78 = (ExprList *)((ulong)local_78 & 0xffffffff00000000);
        iVar8 = local_84;
        for (; pVVar3 = local_58, lVar19 < (long)(ulong)pWVar4->nLTerm; lVar19 = lVar19 + 1) {
          if (pWVar4->aLTerm[lVar19]->pExpr == pEVar17) {
            local_90 = lVar19;
            if (local_ac == 1) {
              iVar9 = sqlite3VdbeAddOp2(local_58,0x80,p1,iVar8);
            }
            else {
              if (local_a8 == (int *)0x0) {
                iVar9 = 0;
              }
              else {
                lVar19 = (long)(int)local_78;
                local_78 = (ExprList *)CONCAT44(local_78._4_4_,(int)local_78 + 1);
                iVar9 = local_a8[lVar19];
              }
              iVar9 = sqlite3VdbeAddOp3(local_58,0x5a,p1,iVar9,iVar8);
            }
            pIVar12->addrInTop = iVar9;
            sqlite3VdbeAddOp1(pVVar3,0x32,iVar8);
            if (lVar14 == 0) {
              pIVar12->iCur = p1;
              pIVar12->eEndLoopOp = (u8)local_60;
              if ((iEq < 1) || (uVar20 = pWVar4->wsFlags, (uVar20 >> 10 & 1) != 0)) {
                pIVar12->nPrefix = 0;
              }
              else {
                pIVar12->iBase = (int)local_68;
                pIVar12->nPrefix = iEq;
                pWVar4->wsFlags = uVar20 | 0x40000;
              }
            }
            else {
              pIVar12->eEndLoopOp = 0xaa;
            }
            pIVar12 = pIVar12 + 1;
            lVar19 = local_90;
          }
          lVar14 = lVar14 + -1;
          iVar8 = iVar8 + 1;
        }
      }
      sqlite3DbFree(pParse->db,local_a8);
      pTerm = local_50;
      pLevel = local_48;
      iTarget = local_84;
      goto LAB_0018e368;
    }
  }
  iTarget = sqlite3ExprCodeTarget(pParse,pEVar17->pRight,iTarget);
LAB_0018e368:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    iTab = 0;
    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0, &iTab);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap, &iTab);
        pTerm->pExpr->iTable = iTab;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(pParse);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}